

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::~Compiler(Compiler *this)

{
  Compiler *this_local;
  
  SchemaLoader::~SchemaLoader(&this->loader);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~MutexGuarded
            (&this->impl);
  return;
}

Assistant:

Compiler::~Compiler() noexcept(false) {}